

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

int BZ2_bzDecompress(bz_stream *strm)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  DState *s;
  UInt16 *pUVar5;
  UInt32 *pUVar6;
  int iVar7;
  uint uVar8;
  Int32 IVar9;
  long lVar10;
  Int32 na;
  Int32 IVar11;
  Int32 IVar12;
  bz_stream *pbVar13;
  Int32 na_1;
  uint uVar14;
  UChar *pUVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  UInt32 UVar19;
  UInt32 UVar20;
  ulong uVar21;
  Int32 na_9;
  int iVar22;
  uint uVar23;
  int iVar24;
  Int32 na_8;
  uint uVar25;
  uint uVar26;
  UChar UVar27;
  Int32 na_7;
  Int32 na_6;
  
  IVar9 = -2;
  if (((strm != (bz_stream *)0x0) && (s = (DState *)strm->state, s != (DState *)0x0)) &&
     (s->strm == strm)) {
    IVar11 = s->state;
LAB_001053f6:
    do {
      IVar9 = 0;
      if (IVar11 == 1) {
        return -1;
      }
      if (IVar11 == 2) {
        if (s->smallDecompress == '\0') {
          if (s->blockRandomised == '\0') {
            UVar19 = s->calculatedBlockCRC;
            IVar9 = s->state_out_len;
            pUVar6 = s->tt;
            uVar21 = (ulong)s->tPos;
            pUVar15 = (UChar *)s->strm->next_out;
            uVar18 = s->strm->avail_out;
            iVar16 = s->save_nblock;
            iVar7 = iVar16 + 1;
            uVar8 = s->blockSize100k * 100000;
            IVar11 = s->nblock_used;
            uVar23 = s->k0;
            uVar25 = uVar18;
            uVar14 = (uint)s->state_out_ch;
            while( true ) {
              UVar27 = (UChar)uVar14;
              UVar20 = (UInt32)uVar21;
              IVar12 = IVar11;
              uVar17 = uVar23;
              if (IVar9 < 1) goto LAB_00105ff7;
              if (uVar25 == 0) break;
              lVar10 = 0;
              while (IVar9 + -1 != (int)lVar10) {
                pUVar15[lVar10] = UVar27;
                UVar19 = UVar19 << 8 ^ BZ2_crc32Table[UVar19 >> 0x18 ^ uVar14 & 0xff];
                lVar10 = lVar10 + 1;
                if (uVar25 == (uint)lVar10) {
                  pUVar15 = pUVar15 + lVar10;
                  IVar9 = IVar9 - (uint)lVar10;
                  goto LAB_0010611f;
                }
              }
              uVar25 = uVar25 - (int)lVar10;
              pUVar15 = pUVar15 + lVar10;
              uVar17 = uVar14;
              do {
                UVar27 = (UChar)uVar17;
                UVar20 = (UInt32)uVar21;
                if (uVar25 == 0) {
                  uVar25 = 0;
                  IVar9 = 1;
                  goto LAB_00106127;
                }
                *pUVar15 = UVar27;
                UVar19 = UVar19 << 8 ^ BZ2_crc32Table[uVar17 & 0xff ^ UVar19 >> 0x18];
                pUVar15 = pUVar15 + 1;
                uVar25 = uVar25 - 1;
                IVar12 = IVar11;
                uVar17 = uVar23;
LAB_00105ff7:
                UVar20 = (UInt32)uVar21;
                if (IVar12 != iVar7 && iVar7 <= IVar12) {
                  return -4;
                }
                if (IVar12 == iVar7) {
                  IVar9 = 0;
                  IVar11 = iVar7;
                  uVar23 = uVar17;
                  goto LAB_00106127;
                }
                if (uVar8 <= UVar20) {
                  return -4;
                }
                uVar23 = pUVar6[uVar21] & 0xff;
                uVar14 = pUVar6[uVar21] >> 8;
                uVar21 = (ulong)uVar14;
                IVar11 = IVar12 + 1;
              } while ((uVar23 != uVar17) || (uVar23 = uVar17, IVar12 == iVar16));
              if (uVar8 <= uVar14) {
                return -4;
              }
              puVar1 = pUVar6 + uVar21;
              uVar26 = *puVar1 >> 8;
              uVar21 = (ulong)uVar26;
              IVar9 = 2;
              IVar11 = iVar7;
              uVar14 = uVar17;
              if ((IVar12 + 2 != iVar7) &&
                 (uVar23 = *puVar1 & 0xff, IVar11 = IVar12 + 2, uVar23 == uVar17)) {
                if (uVar8 <= uVar26) {
                  return -4;
                }
                puVar1 = pUVar6 + uVar21;
                uVar26 = *puVar1 >> 8;
                uVar21 = (ulong)uVar26;
                IVar9 = 3;
                IVar11 = iVar7;
                uVar23 = uVar17;
                if ((IVar12 + 3 != iVar7) &&
                   (uVar23 = *puVar1 & 0xff, IVar11 = IVar12 + 3, uVar23 == uVar17)) {
                  if (uVar8 <= uVar26) {
                    return -4;
                  }
                  uVar17 = pUVar6[uVar21] >> 8;
                  if (uVar8 <= uVar17) {
                    return -4;
                  }
                  IVar9 = (pUVar6[uVar21] & 0xff) + 4;
                  uVar23 = pUVar6[uVar17] & 0xff;
                  uVar21 = (ulong)(pUVar6[uVar17] >> 8);
                  IVar11 = IVar12 + 5;
                }
              }
            }
LAB_0010611f:
            uVar25 = 0;
LAB_00106127:
            pbVar13 = s->strm;
            uVar18 = uVar18 - uVar25;
            puVar1 = &pbVar13->total_out_lo32;
            uVar14 = *puVar1;
            *puVar1 = *puVar1 + uVar18;
            if (CARRY4(uVar14,uVar18)) {
              pbVar13->total_out_hi32 = pbVar13->total_out_hi32 + 1;
            }
            s->calculatedBlockCRC = UVar19;
            s->state_out_ch = UVar27;
            s->state_out_len = IVar9;
            s->nblock_used = IVar11;
            s->k0 = uVar23;
            s->tt = pUVar6;
            s->tPos = UVar20;
            pbVar13->next_out = (char *)pUVar15;
            pbVar13->avail_out = uVar25;
          }
          else {
            pbVar13 = s->strm;
            if (pbVar13->avail_out != 0) {
              IVar11 = s->state_out_len;
              do {
                if (IVar11 == 0) {
                  iVar7 = s->nblock_used;
                  iVar24 = s->save_nblock;
                  iVar16 = iVar24 + 1;
                  if (iVar7 == iVar16) break;
                  if (iVar7 != iVar16 && iVar16 <= iVar7) {
                    return -4;
                  }
                  s->state_out_len = 1;
                  uVar18 = s->k0;
                  s->state_out_ch = (UChar)uVar18;
                  uVar23 = s->blockSize100k * 100000;
                  if (uVar23 <= s->tPos) {
                    return -4;
                  }
                  pUVar6 = s->tt;
                  uVar25 = pUVar6[s->tPos];
                  uVar14 = uVar25 >> 8;
                  s->tPos = uVar14;
                  iVar16 = s->rNToGo;
                  if (iVar16 == 0) {
                    iVar16 = BZ2_rNums[s->rTPos];
                    iVar22 = s->rTPos + 1;
                    if (iVar22 == 0x200) {
                      iVar22 = IVar9;
                    }
                    s->rTPos = iVar22;
                  }
                  IVar11 = iVar16 + -1;
                  s->rNToGo = IVar11;
                  s->nblock_used = iVar7 + 1;
                  if (iVar7 != iVar24) {
                    uVar25 = uVar25 & 0xff ^ (uint)(IVar11 == 1);
                    if (uVar25 == uVar18) {
                      s->state_out_len = 2;
                      if (uVar23 <= uVar14) {
                        return -4;
                      }
                      uVar25 = pUVar6[uVar14];
                      uVar14 = uVar25 >> 8;
                      s->tPos = uVar14;
                      if (IVar11 == 0) {
                        IVar11 = BZ2_rNums[s->rTPos];
                        iVar16 = s->rTPos + 1;
                        if (iVar16 == 0x200) {
                          iVar16 = IVar9;
                        }
                        s->rTPos = iVar16;
                      }
                      IVar11 = IVar11 + -1;
                      s->rNToGo = IVar11;
                      s->nblock_used = iVar7 + 2;
                      if (iVar7 + 1 != iVar24) {
                        uVar25 = uVar25 & 0xff ^ (uint)(IVar11 == 1);
                        if (uVar25 == uVar18) {
                          s->state_out_len = 3;
                          if (uVar23 <= uVar14) {
                            return -4;
                          }
                          uVar25 = pUVar6[uVar14];
                          uVar14 = uVar25 >> 8;
                          s->tPos = uVar14;
                          if (IVar11 == 0) {
                            IVar11 = BZ2_rNums[s->rTPos];
                            iVar16 = s->rTPos + 1;
                            if (iVar16 == 0x200) {
                              iVar16 = IVar9;
                            }
                            s->rTPos = iVar16;
                          }
                          IVar11 = IVar11 + -1;
                          s->rNToGo = IVar11;
                          s->nblock_used = iVar7 + 3;
                          if (iVar7 + 2 != iVar24) {
                            uVar25 = uVar25 & 0xff ^ (uint)(IVar11 == 1);
                            if (uVar25 == uVar18) {
                              if (uVar23 <= uVar14) {
                                return -4;
                              }
                              uVar18 = pUVar6[uVar14];
                              uVar25 = uVar18 >> 8;
                              s->tPos = uVar25;
                              if (IVar11 == 0) {
                                IVar11 = BZ2_rNums[s->rTPos];
                                iVar16 = s->rTPos + 1;
                                if (iVar16 == 0x200) {
                                  iVar16 = IVar9;
                                }
                                s->rTPos = iVar16;
                              }
                              IVar11 = IVar11 + -1;
                              s->rNToGo = IVar11;
                              s->nblock_used = iVar7 + 4;
                              s->state_out_len = (uVar18 & 0xff ^ (uint)(IVar11 == 1)) + 4;
                              if (uVar23 <= uVar25) {
                                return -4;
                              }
                              uVar18 = pUVar6[uVar25];
                              uVar23 = uVar18 & 0xff;
                              s->k0 = uVar23;
                              s->tPos = uVar18 >> 8;
                              if (IVar11 == 0) {
                                IVar11 = BZ2_rNums[s->rTPos];
                                iVar16 = s->rTPos + 1;
                                if (iVar16 == 0x200) {
                                  iVar16 = IVar9;
                                }
                                s->rTPos = iVar16;
                              }
                              s->rNToGo = IVar11 + -1;
                              s->k0 = uVar23 ^ IVar11 + -1 == 1;
                              s->nblock_used = iVar7 + 5;
                            }
                            else {
                              s->k0 = uVar25;
                            }
                          }
                        }
                        else {
                          s->k0 = uVar25;
                        }
                      }
                    }
                    else {
                      s->k0 = uVar25;
                    }
                  }
                  if (pbVar13->avail_out == 0) break;
                }
                bVar2 = s->state_out_ch;
                *pbVar13->next_out = bVar2;
                s->calculatedBlockCRC =
                     s->calculatedBlockCRC << 8 ^
                     BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)bVar2];
                IVar11 = s->state_out_len + -1;
                s->state_out_len = IVar11;
                pbVar13 = s->strm;
                pbVar13->next_out = pbVar13->next_out + 1;
                uVar18 = pbVar13->avail_out - 1;
                pbVar13->avail_out = uVar18;
                puVar1 = &pbVar13->total_out_lo32;
                *puVar1 = *puVar1 + 1;
                if (*puVar1 == 0) {
                  pbVar13->total_out_hi32 = pbVar13->total_out_hi32 + 1;
                }
              } while (uVar18 != 0);
            }
          }
        }
        else {
          pbVar13 = s->strm;
          if (s->blockRandomised == '\0') {
            if (pbVar13->avail_out != 0) {
              IVar9 = s->state_out_len;
              do {
                if (IVar9 == 0) {
                  iVar7 = s->nblock_used;
                  iVar24 = s->save_nblock;
                  iVar16 = iVar24 + 1;
                  if (iVar7 == iVar16) break;
                  if (iVar7 != iVar16 && iVar16 <= iVar7) {
                    return -4;
                  }
                  s->state_out_len = 1;
                  uVar18 = s->tPos;
                  uVar23 = s->k0;
                  s->state_out_ch = (UChar)uVar23;
                  uVar25 = s->blockSize100k * 100000;
                  if (uVar25 <= uVar18) {
                    return -4;
                  }
                  uVar14 = 0;
                  uVar8 = 0x100;
                  do {
                    uVar26 = (int)(uVar14 + uVar8) >> 1;
                    uVar17 = uVar26;
                    if (s->cftab[(int)uVar26] <= (int)uVar18) {
                      uVar17 = uVar8;
                      uVar14 = uVar26;
                    }
                    uVar8 = uVar17;
                  } while (uVar8 - uVar14 != 1);
                  pUVar5 = s->ll16;
                  pUVar15 = s->ll4;
                  uVar3 = pUVar5[uVar18];
                  uVar18 = (pUVar15[uVar18 >> 1] >> ((char)uVar18 * '\x04' & 4U) & 0xf) << 0x10 |
                           (uint)uVar3;
                  s->tPos = uVar18;
                  s->nblock_used = iVar7 + 1;
                  if (iVar7 != iVar24) {
                    if ((uVar14 & 0xff) == uVar23) {
                      s->state_out_len = 2;
                      if (uVar25 <= uVar18) {
                        return -4;
                      }
                      uVar14 = 0;
                      uVar8 = 0x100;
                      do {
                        uVar26 = (int)(uVar14 + uVar8) >> 1;
                        uVar17 = uVar26;
                        if (s->cftab[(int)uVar26] <= (int)uVar18) {
                          uVar17 = uVar8;
                          uVar14 = uVar26;
                        }
                        uVar8 = uVar17;
                      } while (uVar8 - uVar14 != 1);
                      uVar4 = pUVar5[uVar18];
                      uVar18 = (pUVar15[uVar18 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) << 0x10 |
                               (uint)uVar4;
                      s->tPos = uVar18;
                      s->nblock_used = iVar7 + 2;
                      if (iVar7 + 1 != iVar24) {
                        if ((uVar14 & 0xff) == uVar23) {
                          s->state_out_len = 3;
                          if (uVar25 <= uVar18) {
                            return -4;
                          }
                          uVar14 = 0;
                          uVar8 = 0x100;
                          do {
                            uVar26 = (int)(uVar14 + uVar8) >> 1;
                            uVar17 = uVar26;
                            if (s->cftab[(int)uVar26] <= (int)uVar18) {
                              uVar17 = uVar8;
                              uVar14 = uVar26;
                            }
                            uVar8 = uVar17;
                          } while (uVar8 - uVar14 != 1);
                          uVar3 = pUVar5[uVar18];
                          uVar18 = (pUVar15[uVar18 >> 1] >> (((byte)uVar4 & 1) << 2) & 0xf) << 0x10
                                   | (uint)uVar3;
                          s->tPos = uVar18;
                          s->nblock_used = iVar7 + 3;
                          if (iVar7 + 2 != iVar24) {
                            if ((uVar14 & 0xff) == uVar23) {
                              if (uVar25 <= uVar18) {
                                return -4;
                              }
                              uVar23 = 0;
                              uVar14 = 0x100;
                              do {
                                uVar17 = (int)(uVar23 + uVar14) >> 1;
                                uVar8 = uVar17;
                                if (s->cftab[(int)uVar17] <= (int)uVar18) {
                                  uVar8 = uVar14;
                                  uVar23 = uVar17;
                                }
                                uVar14 = uVar8;
                              } while (uVar14 - uVar23 != 1);
                              uVar4 = pUVar5[uVar18];
                              uVar18 = (pUVar15[uVar18 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) <<
                                       0x10 | (uint)uVar4;
                              s->tPos = uVar18;
                              s->nblock_used = iVar7 + 4;
                              s->state_out_len = (uVar23 & 0xff) + 4;
                              if (uVar25 <= uVar18) {
                                return -4;
                              }
                              iVar16 = 0;
                              iVar24 = 0x100;
                              do {
                                iVar22 = iVar16 + iVar24 >> 1;
                                if (s->cftab[iVar22] <= (int)uVar18) {
                                  iVar16 = iVar22;
                                  iVar22 = iVar24;
                                }
                                iVar24 = iVar22;
                              } while (iVar24 - iVar16 != 1);
                              s->k0 = iVar16;
                              s->tPos = (pUVar15[uVar18 >> 1] >> (((byte)uVar4 & 1) << 2) & 0xf) <<
                                        0x10 | (uint)pUVar5[uVar18];
                              s->nblock_used = iVar7 + 5;
                            }
                            else {
                              s->k0 = uVar14 & 0xff;
                            }
                          }
                        }
                        else {
                          s->k0 = uVar14 & 0xff;
                        }
                      }
                    }
                    else {
                      s->k0 = uVar14 & 0xff;
                    }
                  }
                  if (pbVar13->avail_out == 0) break;
                }
                bVar2 = s->state_out_ch;
                *pbVar13->next_out = bVar2;
                s->calculatedBlockCRC =
                     s->calculatedBlockCRC << 8 ^
                     BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)bVar2];
                IVar9 = s->state_out_len + -1;
                s->state_out_len = IVar9;
                pbVar13 = s->strm;
                pbVar13->next_out = pbVar13->next_out + 1;
                uVar18 = pbVar13->avail_out - 1;
                pbVar13->avail_out = uVar18;
                puVar1 = &pbVar13->total_out_lo32;
                *puVar1 = *puVar1 + 1;
                if (*puVar1 == 0) {
                  pbVar13->total_out_hi32 = pbVar13->total_out_hi32 + 1;
                }
              } while (uVar18 != 0);
            }
          }
          else if (pbVar13->avail_out != 0) {
            IVar9 = s->state_out_len;
            do {
              if (IVar9 == 0) {
                iVar7 = s->nblock_used;
                iVar24 = s->save_nblock;
                iVar16 = iVar24 + 1;
                if (iVar7 == iVar16) break;
                if (iVar7 != iVar16 && iVar16 <= iVar7) {
                  return -4;
                }
                s->state_out_len = 1;
                uVar18 = s->tPos;
                uVar23 = s->k0;
                s->state_out_ch = (UChar)uVar23;
                uVar25 = s->blockSize100k * 100000;
                if (uVar25 <= uVar18) {
                  return -4;
                }
                uVar14 = 0;
                uVar8 = 0x100;
                do {
                  uVar17 = (int)(uVar14 + uVar8) >> 1;
                  if (s->cftab[(int)uVar17] <= (int)uVar18) {
                    uVar14 = uVar17;
                    uVar17 = uVar8;
                  }
                  uVar8 = uVar17;
                } while (uVar8 - uVar14 != 1);
                pUVar15 = s->ll4;
                pUVar5 = s->ll16;
                uVar3 = pUVar5[uVar18];
                uVar18 = (pUVar15[uVar18 >> 1] >> ((char)uVar18 * '\x04' & 4U) & 0xf) << 0x10 |
                         (uint)uVar3;
                s->tPos = uVar18;
                iVar16 = s->rNToGo;
                if (iVar16 == 0) {
                  iVar16 = BZ2_rNums[s->rTPos];
                  iVar22 = s->rTPos + 1;
                  if (iVar22 == 0x200) {
                    iVar22 = 0;
                  }
                  s->rTPos = iVar22;
                }
                IVar9 = iVar16 + -1;
                s->rNToGo = IVar9;
                s->nblock_used = iVar7 + 1;
                if (iVar7 != iVar24) {
                  uVar14 = uVar14 & 0xff ^ (uint)(IVar9 == 1);
                  if (uVar14 == uVar23) {
                    s->state_out_len = 2;
                    if (uVar25 <= uVar18) {
                      return -4;
                    }
                    uVar14 = 0;
                    uVar8 = 0x100;
                    do {
                      uVar17 = (int)(uVar14 + uVar8) >> 1;
                      if (s->cftab[(int)uVar17] <= (int)uVar18) {
                        uVar14 = uVar17;
                        uVar17 = uVar8;
                      }
                      uVar8 = uVar17;
                    } while (uVar8 - uVar14 != 1);
                    uVar4 = pUVar5[uVar18];
                    uVar18 = (pUVar15[uVar18 >> 1] >> (((byte)uVar3 & 1) << 2) & 0xf) << 0x10 |
                             (uint)uVar4;
                    s->tPos = uVar18;
                    if (IVar9 == 0) {
                      IVar9 = BZ2_rNums[s->rTPos];
                      IVar11 = s->rTPos + 1;
                      if (IVar11 == 0x200) {
                        IVar11 = 0;
                      }
                      s->rTPos = IVar11;
                    }
                    IVar9 = IVar9 + -1;
                    s->rNToGo = IVar9;
                    s->nblock_used = iVar7 + 2;
                    if (iVar7 + 1 != iVar24) {
                      uVar14 = uVar14 & 0xff ^ (uint)(IVar9 == 1);
                      if (uVar14 == uVar23) {
                        s->state_out_len = 3;
                        if (uVar25 <= uVar18) {
                          return -4;
                        }
                        uVar14 = 0;
                        uVar8 = 0x100;
                        do {
                          uVar26 = (int)(uVar14 + uVar8) >> 1;
                          uVar17 = uVar26;
                          if (s->cftab[(int)uVar26] <= (int)uVar18) {
                            uVar17 = uVar8;
                            uVar14 = uVar26;
                          }
                          uVar8 = uVar17;
                        } while (uVar8 - uVar14 != 1);
                        uVar3 = pUVar5[uVar18];
                        uVar18 = (pUVar15[uVar18 >> 1] >>
                                  (sbyte)(((ulong)uVar4 & 0x3fffffffffffffc1) << 2) & 0xf) << 0x10 |
                                 (uint)uVar3;
                        s->tPos = uVar18;
                        if (IVar9 == 0) {
                          IVar9 = BZ2_rNums[s->rTPos];
                          IVar11 = s->rTPos + 1;
                          if (IVar11 == 0x200) {
                            IVar11 = 0;
                          }
                          s->rTPos = IVar11;
                        }
                        IVar9 = IVar9 + -1;
                        s->rNToGo = IVar9;
                        s->nblock_used = iVar7 + 3;
                        if (iVar7 + 2 != iVar24) {
                          uVar14 = uVar14 & 0xff ^ (uint)(IVar9 == 1);
                          if (uVar14 != uVar23) goto LAB_00105848;
                          if (uVar25 <= uVar18) {
                            return -4;
                          }
                          uVar23 = 0;
                          uVar14 = 0x100;
                          do {
                            uVar17 = (int)(uVar23 + uVar14) >> 1;
                            uVar8 = uVar17;
                            if (s->cftab[(int)uVar17] <= (int)uVar18) {
                              uVar8 = uVar14;
                              uVar23 = uVar17;
                            }
                            uVar14 = uVar8;
                          } while (uVar14 - uVar23 != 1);
                          uVar4 = pUVar5[uVar18];
                          uVar18 = (pUVar15[uVar18 >> 1] >>
                                    (sbyte)(((ulong)uVar3 & 0x3fffffffffffffc1) << 2) & 0xf) << 0x10
                                   | (uint)uVar4;
                          s->tPos = uVar18;
                          if (IVar9 == 0) {
                            IVar9 = BZ2_rNums[s->rTPos];
                            IVar11 = s->rTPos + 1;
                            if (IVar11 == 0x200) {
                              IVar11 = 0;
                            }
                            s->rTPos = IVar11;
                          }
                          IVar9 = IVar9 + -1;
                          s->rNToGo = IVar9;
                          s->nblock_used = iVar7 + 4;
                          s->state_out_len = (uVar23 & 0xff ^ (uint)(IVar9 == 1)) + 4;
                          if (uVar25 <= uVar18) {
                            return -4;
                          }
                          uVar23 = 0;
                          uVar25 = 0x100;
                          do {
                            uVar14 = (int)(uVar23 + uVar25) >> 1;
                            if (s->cftab[(int)uVar14] <= (int)uVar18) {
                              uVar23 = uVar14;
                              uVar14 = uVar25;
                            }
                            uVar25 = uVar14;
                          } while (uVar25 - uVar23 != 1);
                          s->k0 = uVar23;
                          s->tPos = (pUVar15[uVar18 >> 1] >>
                                     (sbyte)(((ulong)uVar4 & 0x3fffffffffffffc1) << 2) & 0xf) <<
                                    0x10 | (uint)pUVar5[uVar18];
                          if (IVar9 == 0) {
                            IVar9 = BZ2_rNums[s->rTPos];
                            IVar11 = s->rTPos + 1;
                            if (IVar11 == 0x200) {
                              IVar11 = 0;
                            }
                            s->rTPos = IVar11;
                          }
                          s->rNToGo = IVar9 + -1;
                          s->k0 = uVar23 ^ IVar9 + -1 == 1;
                          s->nblock_used = iVar7 + 5;
                        }
                      }
                      else {
LAB_00105848:
                        s->k0 = uVar14;
                      }
                    }
                  }
                  else {
                    s->k0 = uVar14;
                  }
                }
                if (pbVar13->avail_out == 0) break;
              }
              bVar2 = s->state_out_ch;
              *pbVar13->next_out = bVar2;
              s->calculatedBlockCRC =
                   s->calculatedBlockCRC << 8 ^
                   BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)bVar2];
              IVar9 = s->state_out_len + -1;
              s->state_out_len = IVar9;
              pbVar13 = s->strm;
              pbVar13->next_out = pbVar13->next_out + 1;
              uVar18 = pbVar13->avail_out - 1;
              pbVar13->avail_out = uVar18;
              puVar1 = &pbVar13->total_out_lo32;
              *puVar1 = *puVar1 + 1;
              if (*puVar1 == 0) {
                pbVar13->total_out_hi32 = pbVar13->total_out_hi32 + 1;
              }
            } while (uVar18 != 0);
          }
        }
        if (s->nblock_used != s->save_nblock + 1) {
          return 0;
        }
        if (s->state_out_len != 0) {
          return 0;
        }
        uVar18 = ~s->calculatedBlockCRC;
        s->calculatedBlockCRC = uVar18;
        if (s->storedBlockCRC != uVar18) {
          return -4;
        }
        s->calculatedCombinedCRC =
             (s->calculatedCombinedCRC << 1 | (uint)((int)s->calculatedCombinedCRC < 0)) ^ uVar18;
        s->state = 0xe;
      }
      else if (IVar11 < 10) goto LAB_001053f6;
      IVar9 = BZ2_decompress(s);
      if (IVar9 == 4) {
        return (uint)(s->calculatedCombinedCRC == s->storedCombinedCRC) * 8 + -4;
      }
      IVar11 = 2;
    } while (s->state == 2);
  }
  return IVar9;
}

Assistant:

int BZ_API(BZ2_bzDecompress) ( bz_stream *strm )
{
   Bool    corrupt;
   DState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   while (True) {
      if (s->state == BZ_X_IDLE) return BZ_SEQUENCE_ERROR;
      if (s->state == BZ_X_OUTPUT) {
         if (s->smallDecompress)
            corrupt = unRLE_obuf_to_output_SMALL ( s ); else
            corrupt = unRLE_obuf_to_output_FAST  ( s );
         if (corrupt) return BZ_DATA_ERROR;
         if (s->nblock_used == s->save_nblock+1 && s->state_out_len == 0) {
            BZ_FINALISE_CRC ( s->calculatedBlockCRC );
            if (s->verbosity >= 3) 
               VPrintf2 ( " {0x%08x, 0x%08x}", s->storedBlockCRC, 
                          s->calculatedBlockCRC );
            if (s->verbosity >= 2) VPrintf0 ( "]" );
            if (s->calculatedBlockCRC != s->storedBlockCRC)
               return BZ_DATA_ERROR;
            s->calculatedCombinedCRC 
               = (s->calculatedCombinedCRC << 1) | 
                    (s->calculatedCombinedCRC >> 31);
            s->calculatedCombinedCRC ^= s->calculatedBlockCRC;
            s->state = BZ_X_BLKHDR_1;
         } else {
            return BZ_OK;
         }
      }
      if (s->state >= BZ_X_MAGIC_1) {
         Int32 r = BZ2_decompress ( s );
         if (r == BZ_STREAM_END) {
            if (s->verbosity >= 3)
               VPrintf2 ( "\n    combined CRCs: stored = 0x%08x, computed = 0x%08x", 
                          s->storedCombinedCRC, s->calculatedCombinedCRC );
            if (s->calculatedCombinedCRC != s->storedCombinedCRC)
               return BZ_DATA_ERROR;
            return r;
         }
         if (s->state != BZ_X_OUTPUT) return r;
      }
   }

   AssertH ( 0, 6001 );

   return 0;  /*NOTREACHED*/
}